

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

void __thiscall adios2::core::VariableBase::SetSelection(VariableBase *this,Box<Dims> *boxDims)

{
  DataType DVar1;
  bool bVar2;
  DataType DVar3;
  size_type sVar4;
  size_type sVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  Dims *count;
  Dims *start;
  char *in_stack_fffffffffffffba0;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  int commRank;
  string *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc40;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  undefined1 local_359 [40];
  allocator local_331;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  string local_258 [32];
  string local_238 [39];
  undefined1 local_211 [40];
  undefined1 local_1e9 [40];
  undefined1 local_1c1 [33];
  string local_1a0 [32];
  string local_180 [39];
  undefined1 local_159 [40];
  undefined1 local_131 [40];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  local_20 = in_RSI + 1;
  DVar1 = *(DataType *)(in_RDI + 0x28);
  local_18 = in_RSI;
  DVar3 = helper::GetDataType<std::__cxx11::string>();
  if ((DVar1 == DVar3) && (*(int *)(in_RDI + 0x40) != 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Core",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"VariableBase",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"SetSelection",&local_a1);
    std::operator+((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (((*(byte *)(in_RDI + 0x54) & 1) != 0) && (*(int *)(in_RDI + 0x40) != 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Core",&local_109);
    in_stack_fffffffffffffc00 = (string *)local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_131 + 1),"VariableBase",(allocator *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffbf8 = (string *)local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_159 + 1),"SetSelection",(allocator *)in_stack_fffffffffffffbf8);
    std::operator+((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)(local_159 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_159);
    std::__cxx11::string::~string((string *)(local_131 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if ((*(byte *)(in_RDI + 0x218) & 1) != 0) {
    in_stack_fffffffffffffbf0 = (string *)local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1c1 + 1),"Core",(allocator *)in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffbe8 = (string *)local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1e9 + 1),"VariableBase",(allocator *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbe0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_211 + 1),"SetSelection",(allocator *)in_stack_fffffffffffffbe0);
    std::operator+((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string((string *)(local_211 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_211);
    std::__cxx11::string::~string((string *)(local_1e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e9);
    std::__cxx11::string::~string((string *)(local_1c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1c1);
  }
  if (*(int *)(in_RDI + 0x40) == 2) {
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x58));
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
    if (sVar4 == sVar5) {
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x58));
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
      if (sVar4 == sVar5) goto LAB_00963b30;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"Core",&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"VariableBase",&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"SetSelection",&local_2c9);
    std::operator+((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
  }
LAB_00963b30:
  if (*(int *)(in_RDI + 0x40) == 3) {
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_fffffffffffffbb0);
    if (!bVar2) {
      paVar6 = &local_331;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,"Core",paVar6);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_359;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_359 + 1),"VariableBase",(allocator *)__lhs);
      paVar6 = &local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"SetSelection",paVar6);
      std::operator+((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      commRank = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
      std::operator+(__lhs,(char *)paVar6);
      helper::Throw<std::invalid_argument>
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8,commRank);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      std::__cxx11::string::~string((string *)(local_359 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_359);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  *(undefined4 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

void VariableBase::SetSelection(const Box<Dims> &boxDims)
{
    const Dims &start = boxDims.first;
    const Dims &count = boxDims.second;

    if (m_Type == helper::GetDataType<std::string>() && m_ShapeID != ShapeID::GlobalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "string variable " + m_Name +
                                                 " not a GlobalArray, it can't have a "
                                                 "selection, in call to SetSelection");
    }

    if (m_SingleValue && m_ShapeID != ShapeID::GlobalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "selection is not valid for single value variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ConstantDims)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "selection is not valid for constant shape variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ShapeID == ShapeID::GlobalArray &&
        (m_Shape.size() != count.size() || m_Shape.size() != start.size()))
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "count and start must be the "
                                             "same size as shape for variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ShapeID == ShapeID::JoinedArray && !start.empty())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "start argument must be empty "
                                             "for joined array variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    m_Start = start;
    m_Count = count;
    m_SelectionType = SelectionType::BoundingBox;
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    UpdateLayout(m_Count);
    UpdateLayout(m_Start);
#endif
}